

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connections.cpp
# Opt level: O0

shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>_>
 __thiscall
tinygraph::vertex_link_abi_cxx11_
          (tinygraph *this,shared_ptr<tinygraph::Vertex> *from,shared_ptr<tinygraph::Vertex> *to,
          bool undirected)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>_>
  sVar4;
  undefined1 local_88 [8];
  shared_ptr<tinygraph::Edge> from_edge;
  undefined1 local_58 [8];
  shared_ptr<tinygraph::Edge> to_edge;
  type to_cp;
  type from_cp;
  bool undirected_local;
  shared_ptr<tinygraph::Vertex> *to_local;
  shared_ptr<tinygraph::Vertex> *from_local;
  
  std::shared_ptr<tinygraph::Vertex>::shared_ptr
            ((shared_ptr<tinygraph::Vertex> *)
             &to_cp.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             from);
  std::shared_ptr<tinygraph::Vertex>::shared_ptr
            ((shared_ptr<tinygraph::Vertex> *)
             &to_edge.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>._M_refcount,to
            );
  std::make_shared<tinygraph::Edge,std::shared_ptr<tinygraph::Vertex>&>
            ((shared_ptr<tinygraph::Vertex> *)local_58);
  std::
  make_shared<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
            ();
  peVar1 = std::__shared_ptr_access<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_58);
  __r = &from_edge.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>_>
  ::operator=(&peVar1->properties,
              (shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>_>
               *)__r);
  std::
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>_>
  ::~shared_ptr((shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>_>
                 *)__r);
  peVar2 = std::__shared_ptr_access<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&to_cp.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::vector<std::shared_ptr<tinygraph::Edge>,_std::allocator<std::shared_ptr<tinygraph::Edge>_>_>
  ::push_back(&peVar2->connections,(value_type *)local_58);
  if (undirected) {
    std::make_shared<tinygraph::Edge,std::shared_ptr<tinygraph::Vertex>&>
              ((shared_ptr<tinygraph::Vertex> *)local_88);
    peVar1 = std::__shared_ptr_access<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_58);
    peVar3 = std::__shared_ptr_access<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
    std::
    shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>_>
    ::operator=(&peVar3->properties,&peVar1->properties);
    peVar1 = std::__shared_ptr_access<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_58);
    peVar2 = std::__shared_ptr_access<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)peVar1);
    std::
    vector<std::shared_ptr<tinygraph::Edge>,_std::allocator<std::shared_ptr<tinygraph::Edge>_>_>::
    push_back(&peVar2->connections,(value_type *)local_88);
    std::shared_ptr<tinygraph::Edge>::~shared_ptr((shared_ptr<tinygraph::Edge> *)local_88);
  }
  peVar1 = std::__shared_ptr_access<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_58);
  std::
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>_>
  ::shared_ptr((shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>_>
                *)this,&peVar1->properties);
  std::shared_ptr<tinygraph::Edge>::~shared_ptr((shared_ptr<tinygraph::Edge> *)local_58);
  std::shared_ptr<tinygraph::Vertex>::~shared_ptr
            ((shared_ptr<tinygraph::Vertex> *)
             &to_edge.super___shared_ptr<tinygraph::Edge,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<tinygraph::Vertex>::~shared_ptr
            ((shared_ptr<tinygraph::Vertex> *)
             &to_cp.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar4.
  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar4.
  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>_>
          )sVar4.
           super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<std::map<std::string, std::any>> vertex_link(std::shared_ptr<Vertex> from, std::shared_ptr<Vertex> to, bool undirected) {
        auto from_cp = std::move(from);
        auto to_cp = std::move(to);

        auto to_edge = std::make_shared<Edge>(to_cp);
        to_edge->properties = std::make_shared<std::map<std::string, std::any>>();
        from_cp->connections.push_back(to_edge);

        if (undirected) {
            auto from_edge = std::make_shared<Edge>(from_cp);
            from_edge->properties = to_edge->properties;
            to_edge->to->connections.push_back(from_edge);
        }

        return to_edge->properties;
    }